

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_avx512::Convolution_x86_avx512(Convolution_x86_avx512 *this)

{
  long *in_RDI;
  Convolution *in_stack_ffffffffffffff20;
  
  Convolution::Convolution(in_stack_ffffffffffffff20);
  *in_RDI = (long)&PTR_create_pipeline_01d2e0c8;
  in_RDI[0x3b] = (long)&PTR__Convolution_x86_avx512_01d2e150;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  *(undefined4 *)(in_RDI + 0xf) = 0;
  in_RDI[0x10] = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  in_RDI[0x19] = 0;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  *(undefined4 *)((long)in_RDI + 0xd4) = 0;
  *(undefined4 *)(in_RDI + 0x1b) = 0;
  *(undefined4 *)((long)in_RDI + 0xdc) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  in_RDI[0x22] = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)((long)in_RDI + 0x124) = 0;
  *(undefined4 *)(in_RDI + 0x25) = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  in_RDI[0x2b] = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  *(undefined4 *)((long)in_RDI + 0x16c) = 0;
  *(undefined4 *)(in_RDI + 0x2e) = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  in_RDI[0x36] = 0;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  *(undefined4 *)((long)in_RDI + 0x1bc) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c4) = 0;
  *(undefined4 *)(in_RDI + 0x39) = 0;
  in_RDI[0x3a] = 0;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  return;
}

Assistant:

Convolution_x86_avx512::Convolution_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    nT = 0;
    convolution_dilation1 = 0;
    gemm = 0;
}